

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Bounds3f * __thiscall
pbrt::AnimatedTransform::BoundPointMotion
          (Bounds3f *__return_storage_ptr__,AnimatedTransform *this,Point3f p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  undefined8 in_R8;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar26 [60];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [64];
  Point3f PVar31;
  span<float> zeros_00;
  float local_120;
  float local_11c;
  int nZeros;
  Float local_110;
  int va;
  undefined1 local_108 [16];
  Bounds3f *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  DerivativeTerm *local_80;
  DerivativeTerm *local_78;
  unsigned_long vb;
  undefined1 local_68 [16];
  Float zeros [8];
  undefined1 auVar22 [56];
  undefined1 auVar25 [64];
  
  auVar24._4_60_ = p._12_60_;
  auVar24._0_4_ = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar28._8_56_ = p._8_56_;
  auVar28._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_e8 = auVar28._0_16_;
  local_68 = vmovshdup_avx(local_e8);
  fVar29 = local_68._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[0][1])),local_e8,
                            ZEXT416((uint)(this->startTransform).m.m[0][0]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[2][1])),local_e8,
                            ZEXT416((uint)(this->startTransform).m.m[2][0]));
  auVar23 = auVar24._0_16_;
  auVar15 = vfmadd231ss_fma(auVar15,auVar23,ZEXT416((uint)(this->startTransform).m.m[0][2]));
  auVar16 = vfmadd231ss_fma(auVar16,auVar23,ZEXT416((uint)(this->startTransform).m.m[2][2]));
  fVar14 = auVar15._0_4_ + (this->startTransform).m.m[0][3];
  fVar9 = auVar16._0_4_ + (this->startTransform).m.m[2][3];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[1][1])),local_e8,
                            ZEXT416((uint)(this->startTransform).m.m[1][0]));
  auVar15 = vfmadd231ss_fma(auVar15,auVar23,ZEXT416((uint)(this->startTransform).m.m[1][2]));
  fVar10 = auVar15._0_4_ + (this->startTransform).m.m[1][3];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[3][1])),local_e8,
                            ZEXT416((uint)(this->startTransform).m.m[3][0]));
  auVar15 = vfmadd231ss_fma(auVar15,auVar23,ZEXT416((uint)(this->startTransform).m.m[3][2]));
  fVar11 = auVar15._0_4_ + (this->startTransform).m.m[3][3];
  bVar8 = fVar11 == 1.0;
  auVar15 = ZEXT416((uint)bVar8 * (int)fVar14 + (uint)!bVar8 * (int)(fVar14 / fVar11));
  auVar16 = ZEXT416((uint)bVar8 * (int)fVar10 + (uint)!bVar8 * (int)(fVar10 / fVar11));
  fVar14 = (float)((uint)bVar8 * (int)fVar9 + (uint)!bVar8 * (int)(fVar9 / fVar11));
  local_f0 = __return_storage_ptr__;
  if (this->actuallyAnimated == false) {
    auVar15 = vinsertps_avx(auVar15,auVar16,0x10);
    uVar3 = vmovlps_avx(auVar15);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = fVar14;
    uVar3 = vmovlps_avx(auVar15);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = fVar14;
  }
  else {
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[0][1])),local_e8,
                              ZEXT416((uint)(this->endTransform).m.m[0][0]));
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[1][1])),local_e8,
                              ZEXT416((uint)(this->endTransform).m.m[1][0]));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[2][1])),local_e8,
                              ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[3][1])),local_e8,
                              ZEXT416((uint)(this->endTransform).m.m[3][0]));
    auVar17 = vfmadd231ss_fma(auVar17,auVar23,ZEXT416((uint)(this->endTransform).m.m[0][2]));
    auVar18 = vfmadd231ss_fma(auVar18,auVar23,ZEXT416((uint)(this->endTransform).m.m[1][2]));
    auVar19 = vfmadd231ss_fma(auVar19,auVar23,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    auVar23 = vfmadd231ss_fma(auVar27,auVar23,ZEXT416((uint)(this->endTransform).m.m[3][2]));
    fVar9 = auVar23._0_4_ + (this->endTransform).m.m[3][3];
    fVar10 = auVar17._0_4_ + (this->endTransform).m.m[0][3];
    fVar11 = auVar18._0_4_ + (this->endTransform).m.m[1][3];
    fVar29 = auVar19._0_4_ + (this->endTransform).m.m[2][3];
    bVar8 = fVar9 == 1.0;
    auVar17 = ZEXT416((uint)bVar8 * (int)fVar10 + (uint)!bVar8 * (int)(fVar10 / fVar9));
    auVar18 = ZEXT416((uint)bVar8 * (int)fVar11 + (uint)!bVar8 * (int)(fVar11 / fVar9));
    auVar19 = ZEXT416((uint)bVar8 * (int)fVar29 + (uint)!bVar8 * (int)(fVar29 / fVar9));
    local_c8 = vminss_avx(auVar18,auVar16);
    local_b8 = vminss_avx(auVar17,auVar15);
    auVar23 = vminss_avx(auVar19,ZEXT416((uint)fVar14));
    local_108 = vmaxss_avx(auVar18,auVar16);
    local_11c = auVar23._0_4_;
    auVar16 = vinsertps_avx(local_b8,local_c8,0x10);
    local_d8 = vmaxss_avx(auVar17,auVar15);
    auVar15 = vmaxss_avx(auVar19,ZEXT416((uint)fVar14));
    uVar3 = vmovlps_avx(auVar16);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    local_120 = auVar15._0_4_;
    auVar15 = vinsertps_avx(local_d8,local_108,0x10);
    uVar3 = vmovlps_avx(auVar15);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    uVar4._0_4_ = this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar4._4_4_ = this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar4;
    uVar5._0_4_ = this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar5._4_4_ = this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar5;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)&this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)&this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_4_ = (float)(undefined4)uVar4 * (float)(undefined4)uVar5;
    auVar15._4_4_ = (float)uVar4._4_4_ * (float)uVar5._4_4_;
    auVar15._8_8_ = 0;
    auVar15 = vmovshdup_avx(auVar15);
    auVar16 = vfmadd231ss_fma(auVar15,auVar16,auVar17);
    auVar15 = vmovshdup_avx(auVar23);
    auVar23 = vfmadd231ss_fma(auVar16,auVar23,auVar18);
    auVar16 = vmovshdup_avx(auVar18);
    auVar16 = vfmadd213ss_fma(auVar16,auVar15,auVar23);
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
    uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar8 = (bool)((byte)uVar3 & 1);
    local_110 = acosf((float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar15._0_4_));
    uVar1 = (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar6 = (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    local_a8._4_4_ = uVar6;
    local_a8._0_4_ = uVar1;
    uVar2 = (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x;
    uVar7 = (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    local_98._4_4_ = uVar7;
    local_98._0_4_ = uVar2;
    auVar28 = ZEXT1664(local_e8);
    local_78 = this->c1;
    lVar13 = 0;
    local_80 = this->c2;
    local_a8._8_8_ = 0;
    local_98._8_8_ = 0;
    do {
      nZeros = 0;
      auVar27 = auVar28._0_16_;
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)this->c3[lVar13].kx),auVar27,
                                ZEXT416((uint)this->c3[lVar13].kc));
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)this->c4[lVar13].kx),auVar27,
                                ZEXT416((uint)this->c4[lVar13].kc));
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)this->c5[lVar13].kx),auVar27,
                                ZEXT416((uint)this->c5[lVar13].kc));
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_78[lVar13].kx),auVar27,
                                ZEXT416((uint)local_78[lVar13].kc));
      auVar15 = vfmadd231ss_fma(auVar15,local_68,ZEXT416((uint)this->c3[lVar13].ky));
      auVar16 = vfmadd231ss_fma(auVar16,local_68,ZEXT416((uint)this->c4[lVar13].ky));
      auVar23 = vfmadd231ss_fma(auVar23,local_68,ZEXT416((uint)this->c5[lVar13].ky));
      auVar17 = vfmadd231ss_fma(auVar17,local_68,ZEXT416((uint)local_78[lVar13].ky));
      auVar19 = ZEXT416((uint)auVar24._0_4_);
      auVar18 = vfmadd231ss_fma(auVar15,auVar19,ZEXT416((uint)this->c3[lVar13].kz));
      auVar16 = vfmadd231ss_fma(auVar16,auVar19,ZEXT416((uint)this->c4[lVar13].kz));
      auVar23 = vfmadd231ss_fma(auVar23,auVar19,ZEXT416((uint)this->c5[lVar13].kz));
      auVar17 = vfmadd231ss_fma(auVar17,auVar19,ZEXT416((uint)local_78[lVar13].kz));
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)local_80[lVar13].kx),auVar27,
                                ZEXT416((uint)local_80[lVar13].kc));
      auVar15 = vfmadd231ss_fma(auVar15,local_68,ZEXT416((uint)local_80[lVar13].ky));
      auVar15 = vfmadd231ss_fma(auVar15,auVar19,ZEXT416((uint)local_80[lVar13].kz));
      zeros_00.n = (size_t)&nZeros;
      zeros_00.ptr = (float *)0x8;
      FindZeros((AnimatedTransform *)zeros,auVar17._0_4_,auVar15._0_4_,auVar18._0_4_,auVar16._0_4_,
                auVar23._0_4_,local_110,(Interval)0x3f80000000000000,zeros_00,(int *)0x8,(int)in_R8)
      ;
      vb = 8;
      va = nZeros;
      if (8 < (uint)nZeros) {
        uVar3 = vmovlps_avx(local_a8);
        (local_f0->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
        (local_f0->pMin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
        uVar3 = vmovlps_avx(local_98);
        (local_f0->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
        (local_f0->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
        (local_f0->pMin).super_Tuple3<pbrt::Point3,_float>.z = local_11c;
        (local_f0->pMax).super_Tuple3<pbrt::Point3,_float>.z = local_120;
        LogFatal<char_const(&)[7],char_const(&)[49],char_const(&)[7],int&,char_const(&)[49],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform.cpp"
                   ,0x458,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [7])"nZeros",
                   (char (*) [49])"(sizeof(::pbrt::detail::ArraySizeHelper(zeros)))",
                   (char (*) [7])"nZeros",&va,
                   (char (*) [49])"(sizeof(::pbrt::detail::ArraySizeHelper(zeros)))",&vb);
      }
      if (nZeros == 0) {
        auVar28 = ZEXT1664(local_e8);
      }
      else {
        auVar28 = ZEXT1664(local_e8);
        auVar30 = ZEXT464((uint)local_11c);
        auVar20 = ZEXT464((uint)local_120);
        lVar12 = 0;
        do {
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(zeros[lVar12] * this->endTime)),
                                    ZEXT416((uint)(1.0 - zeros[lVar12])),
                                    ZEXT416((uint)this->startTime));
          PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar28._0_8_;
          PVar31.super_Tuple3<pbrt::Point3,_float>.z = auVar24._0_4_;
          auVar26 = ZEXT1260((undefined1  [12])0x0);
          auVar22 = ZEXT856(auVar28._8_8_);
          PVar31 = operator()(this,PVar31,auVar15._0_4_);
          auVar25._0_4_ = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
          auVar25._4_60_ = auVar26;
          auVar21._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar21._8_56_ = auVar22;
          auVar16 = auVar21._0_16_;
          auVar15 = vmovshdup_avx(auVar16);
          auVar28 = ZEXT1664(local_e8);
          lVar12 = lVar12 + 1;
          local_b8 = vminss_avx(auVar16,local_b8);
          local_d8 = vmaxss_avx(auVar16,local_d8);
          local_c8 = vminss_avx(auVar15,local_c8);
          auVar16 = vminss_avx(auVar25._0_16_,ZEXT416(auVar30._0_4_));
          auVar30 = ZEXT1664(auVar16);
          local_108 = vmaxss_avx(auVar15,local_108);
          auVar15 = vmaxss_avx(auVar25._0_16_,ZEXT416(auVar20._0_4_));
          auVar20 = ZEXT1664(auVar15);
        } while (lVar12 < nZeros);
        local_98 = vinsertps_avx(local_d8,local_108,0x10);
        local_a8 = vinsertps_avx(local_b8,local_c8,0x10);
        local_120 = auVar15._0_4_;
        local_11c = auVar16._0_4_;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    uVar3 = vmovlps_avx(local_a8);
    (local_f0->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (local_f0->pMin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
    uVar3 = vmovlps_avx(local_98);
    (local_f0->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (local_f0->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
    (local_f0->pMin).super_Tuple3<pbrt::Point3,_float>.z = local_11c;
    (local_f0->pMax).super_Tuple3<pbrt::Point3,_float>.z = local_120;
  }
  return local_f0;
}

Assistant:

Bounds3f AnimatedTransform::BoundPointMotion(Point3f p) const {
    if (!actuallyAnimated)
        return Bounds3f(startTransform(p));
    Bounds3f bounds(startTransform(p), endTransform(p));
    Float cosTheta = Dot(R[0], R[1]);
    Float theta = SafeACos(cosTheta);
    for (int c = 0; c < 3; ++c) {
        // Find any motion derivative zeros for the component _c_
        Float zeros[8];
        int nZeros = 0;
        FindZeros(c1[c].Eval(p), c2[c].Eval(p), c3[c].Eval(p), c4[c].Eval(p),
                  c5[c].Eval(p), theta, Interval(0., 1.), zeros, &nZeros);
        CHECK_LE(nZeros, PBRT_ARRAYSIZE(zeros));

        // Expand bounding box for any motion derivative zeros found
        for (int i = 0; i < nZeros; ++i) {
            Point3f pz = (*this)(p, Lerp(zeros[i], startTime, endTime));
            bounds = Union(bounds, pz);
        }
    }
    return bounds;
}